

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O3

void ResourceConsumingWorker(void)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  timespec local_28;
  
  uVar6 = 0;
  do {
    if (*(long **)(in_FS_OFFSET + -8) != (long *)0x0) {
      cVar2 = (**(code **)(**(long **)(in_FS_OFFSET + -8) + 0x10))();
      if (cVar2 != '\0') break;
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar6);
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_28,1);
    plVar1 = *(long **)(in_FS_OFFSET + -8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))(plVar1,uVar6 & 0xffffffff);
    }
    if (uVar6 != 0) {
      local_28.tv_nsec = uVar6 * 1000000;
      local_28.tv_sec = 0;
      do {
        iVar3 = nanosleep(&local_28,&local_28);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 100);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void ResourceConsumingWorker() {
  for (int i = 0; i < 100 && LimitEffort::ShouldContinue(); ++i) {
    std::cerr << i << ' ';
    LimitEffort::Consume(i);
    std::this_thread::sleep_for(std::chrono::milliseconds(i));
  }
  std::cerr << std::endl;
}